

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O1

IPAsKeyLRU * __thiscall
BinHash<IPAsKeyLRU>::InsertOrAdd
          (BinHash<IPAsKeyLRU> *this,IPAsKeyLRU *key,bool need_alloc,bool *stored)

{
  int iVar1;
  IPAsKeyLRU *pIVar2;
  uint uVar3;
  uint uVar4;
  
  if (key != (IPAsKeyLRU *)0x0) {
    iVar1 = this->tableCount + 1;
    uVar4 = this->tableSize;
    if (uVar4 < (uint)(iVar1 * 2)) {
      uVar3 = 0x80;
      if (uVar4 != 0) {
        uVar3 = uVar4;
      }
      do {
        uVar4 = uVar3;
        uVar3 = uVar4 * 2;
      } while (uVar4 < (uint)(iVar1 * 4));
      Resize(this,uVar4);
    }
    pIVar2 = DoInsert(this,key,need_alloc,stored);
    return pIVar2;
  }
  return (IPAsKeyLRU *)0x0;
}

Assistant:

KeyObj * InsertOrAdd(KeyObj * key, bool need_alloc, bool* stored)
    {
        KeyObj * retKey = NULL;
        unsigned int newCount = tableCount + 1;

        if (key != NULL)
        {
            if (tableSize < 2 * newCount)
            {
                unsigned int newSize = tableSize;

                if (tableSize == 0)
                {
                    newSize = 128;
                }

                while (newSize < 4 * newCount)
                {
                    newSize *= 2;
                }

                Resize(newSize);
            }

            retKey = DoInsert(key, need_alloc, stored);
        }

        return retKey;
    }